

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfocusframe.cpp
# Opt level: O1

void __thiscall QFocusFramePrivate::updateSize(QFocusFramePrivate *this)

{
  QWidget *this_00;
  QWidget *parent;
  QWidget *this_01;
  QWidgetData *pQVar1;
  int iVar2;
  int iVar3;
  Representation RVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  QPoint pos;
  QStyleHintReturnMask local_a8;
  QRect local_98;
  QPoint local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->widget != (QWidget *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
    (**(code **)(*(long *)this_00 + 0x1a0))(this_00,(QStyleOption *)local_78);
    pQVar5 = QWidget::style(this_00);
    iVar2 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x40,(QStyleOption *)local_78,this_00);
    pQVar5 = QWidget::style(this_00);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x41,(QStyleOption *)local_78,this_00);
    local_80 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    RVar4.m_i = QWidget::x(this->widget);
    local_80.yp.m_i = QWidget::y(this->widget);
    local_80.xp.m_i = RVar4.m_i;
    parent = *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10);
    this_01 = *(QWidget **)(*(long *)&this->widget->field_0x8 + 0x10);
    if (parent != this_01) {
      local_80 = QWidget::mapTo(this_01,parent,&local_80);
    }
    local_98.x1.m_i = local_80.xp.m_i - iVar3;
    pQVar1 = this->widget->data;
    local_98.y1.m_i = local_80.yp.m_i - iVar2;
    local_98.x2.m_i =
         (local_98.x1.m_i + iVar3 * 2 + (pQVar1->crect).x2.m_i) - (pQVar1->crect).x1.m_i;
    local_98.y2.m_i =
         (local_98.y1.m_i + iVar2 * 2 + (pQVar1->crect).y2.m_i) - (pQVar1->crect).y1.m_i;
    pQVar1 = this_00->data;
    if (((((pQVar1->crect).x1.m_i != local_98.x1.m_i) || ((pQVar1->crect).x2.m_i != local_98.x2.m_i)
         ) || ((pQVar1->crect).y1.m_i != local_98.y1.m_i)) ||
       ((pQVar1->crect).y2.m_i != local_98.y2.m_i)) {
      QWidget::setGeometry(this_00,&local_98);
      pQVar1 = this_00->data;
      puStack_60 = (undefined1 *)
                   CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                            (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
      local_68 = (undefined1 *)0x0;
      local_a8.super_QStyleHintReturn = (QStyleHintReturn)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QStyleHintReturnMask::QStyleHintReturnMask(&local_a8);
      pQVar5 = QWidget::style(this_00);
      iVar2 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x35,local_78,this_00,&local_a8);
      if (iVar2 != 0) {
        QWidget::setMask(this_00,&local_a8.region);
      }
      QStyleHintReturnMask::~QStyleHintReturnMask(&local_a8);
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFocusFramePrivate::updateSize()
{
    Q_Q(QFocusFrame);
    if (!widget)
        return;

    QStyleOption opt;
    q->initStyleOption(&opt);
    int vmargin = q->style()->pixelMetric(QStyle::PM_FocusFrameVMargin, &opt, q),
        hmargin = q->style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &opt, q);
    QPoint pos(widget->x(), widget->y());
    if (q->parentWidget() != widget->parentWidget())
        pos = widget->parentWidget()->mapTo(q->parentWidget(), pos);
    QRect geom(pos.x()-hmargin, pos.y()-vmargin,
               widget->width()+(hmargin*2), widget->height()+(vmargin*2));
    if (q->geometry() == geom)
        return;

    q->setGeometry(geom);

    opt.rect = q->rect();
    QStyleHintReturnMask mask;
    if (q->style()->styleHint(QStyle::SH_FocusFrame_Mask, &opt, q, &mask))
        q->setMask(mask.region);
}